

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate.cpp
# Opt level: O2

bool __thiscall CaDiCaL::Internal::propagate(Internal *this)

{
  int64_t *piVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  Internal *pIVar5;
  size_t sVar6;
  undefined1 *puVar7;
  pointer piVar8;
  pointer pvVar9;
  pointer pWVar10;
  char *pcVar11;
  pointer pVVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  Clause **ppCVar17;
  int iVar18;
  pointer pWVar19;
  uint uVar20;
  Clause *pCVar21;
  uint uVar22;
  size_t sVar23;
  pointer pWVar24;
  pointer pWVar25;
  Profile *in_RSI;
  Profile *profile;
  Profile *pPVar26;
  ulong uVar27;
  uint *puVar28;
  uint *puVar29;
  uint *puVar30;
  char cVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  uint uVar35;
  pointer pWVar36;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  
  pIVar5 = this->internal;
  profile = in_RSI;
  if ((pIVar5->profiles).propagate.level <= (pIVar5->opts).profile) {
    profile = &(pIVar5->profiles).propagate;
    time(pIVar5,(time_t *)in_RSI);
    start_profiling(pIVar5,profile,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  }
  sVar6 = this->propagated;
  while (pCVar21 = this->conflict, pCVar21 == (Clause *)0x0) {
    puVar7 = (undefined1 *)this->propagated;
    piVar8 = (this->trail).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    profile = (Profile *)
              ((long)(this->trail).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)piVar8 >> 2);
    if ((Profile *)puVar7 == profile) break;
    this->propagated = (size_t)(puVar7 + 1);
    uVar35 = piVar8[(long)puVar7];
    uVar22 = -uVar35;
    if ((int)uVar35 < 1) {
      uVar35 = uVar22;
    }
    uVar20 = uVar35 << 1 | uVar22 >> 0x1f;
    pvVar9 = (this->wtab).
             super__Vector_base<std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>,_std::allocator<std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pWVar36 = pvVar9[uVar20].super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pWVar10 = *(pointer *)
               ((long)&pvVar9[uVar20].
                       super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>._M_impl.
                       super__Vector_impl_data + 8);
    pPVar26 = (Profile *)((ulong)uVar35 * 0x10);
    pWVar19 = pWVar36;
    profile = pPVar26;
LAB_0067de89:
    pWVar24 = pWVar19;
    pWVar25 = pWVar24;
    if (pWVar36 != pWVar10) {
      pWVar25 = pWVar24 + 1;
      ppCVar17 = &pWVar36->clause;
      iVar3 = pWVar36->blit;
      iVar18 = pWVar36->size;
      pWVar36 = pWVar36 + 1;
      pWVar24->clause = *ppCVar17;
      pWVar24->blit = iVar3;
      pWVar24->size = iVar18;
      uVar35 = pWVar24->blit;
      pcVar11 = this->vals;
      pWVar19 = pWVar25;
      if (pcVar11[(int)uVar35] < '\x01') {
        pCVar21 = pWVar24->clause;
        if (pWVar24->size == 2) {
          if (pcVar11[(int)uVar35] < '\0') {
            this->conflict = pCVar21;
          }
          else {
            build_chain_for_units(this,uVar35,pCVar21,false);
            profile = (Profile *)(ulong)uVar35;
            search_assign(this,uVar35,pCVar21);
          }
        }
        else {
          if (this->conflict != (Clause *)0x0) goto LAB_0067e0c3;
          pWVar19 = pWVar24;
          if ((pCVar21->field_0x8 & 0x10) == 0) {
            uVar35 = *(uint *)&pCVar21[1].field_0 ^ *(uint *)((long)&pCVar21[1].field_0 + 4) ^
                     uVar22;
            cVar2 = pcVar11[(int)uVar35];
            if (cVar2 < '\x01') {
              iVar3 = pCVar21->size;
              uVar27 = (ulong)iVar3;
              lVar33 = (long)pCVar21->pos;
              puVar30 = (uint *)((long)&pCVar21[1].field_0 + lVar33 * 4);
              profile = (Profile *)0x0;
              cVar31 = -1;
              puVar29 = puVar30;
              for (lVar34 = uVar27 * 4 + lVar33 * -4; lVar34 != 0; lVar34 = lVar34 + -4) {
                profile = (Profile *)(long)(int)*puVar29;
                cVar31 = pcVar11[(long)profile];
                if (-1 < cVar31) goto LAB_0067dfaf;
                puVar29 = puVar29 + 1;
              }
              puVar28 = (uint *)&pCVar21[1].field_0x8;
              for (lVar33 = lVar33 * 4 + -8; puVar29 = puVar30, lVar33 != 0; lVar33 = lVar33 + -4) {
                profile = (Profile *)(long)(int)*puVar28;
                cVar31 = pcVar11[(long)profile];
                puVar29 = puVar28;
                if (-1 < cVar31) break;
                puVar28 = puVar28 + 1;
              }
LAB_0067dfaf:
              pCVar21->pos = (int)((ulong)((long)puVar29 - (long)(pCVar21 + 1)) >> 2);
              if (cVar31 < '\x01') {
                if (cVar31 == '\0') {
                  *(uint *)&pCVar21[1].field_0 = uVar35;
                  *(int *)((long)&pCVar21[1].field_0 + 4) = (int)profile;
                  *puVar29 = uVar22;
                  uVar35 = uVar22;
                }
                else {
                  if (cVar2 != '\0') {
                    this->conflict = pCVar21;
                    goto LAB_0067e0c3;
                  }
                  build_chain_for_units(this,uVar35,pCVar21,false);
                  profile = (Profile *)(ulong)uVar35;
                  search_assign(this,uVar35,pCVar21);
                  pWVar19 = pWVar25;
                  if ((this->opts).chrono < 2) goto LAB_0067de89;
                  uVar13 = -uVar35;
                  if (0 < (int)uVar35) {
                    uVar13 = uVar35;
                  }
                  pVVar12 = (this->vtab).
                            super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  profile = pPVar26;
                  if (pVVar12[uVar13].level <= *(int *)(&pPVar26->active + (long)pVVar12))
                  goto LAB_0067de89;
                  uVar14 = 2;
                  if (2 < iVar3) {
                    uVar14 = uVar27;
                  }
                  puVar30 = (uint *)&pCVar21[1].field_0x8;
                  profile = (Profile *)0x0;
                  for (uVar32 = 2; uVar16 = uVar14, (long)uVar32 < (long)uVar27; uVar32 = uVar32 + 1
                      ) {
                    uVar4 = *puVar30;
                    profile = (Profile *)(ulong)uVar4;
                    uVar15 = -uVar4;
                    if (0 < (int)uVar4) {
                      uVar15 = uVar4;
                    }
                    uVar16 = uVar32;
                    if (pVVar12[uVar15].level == pVVar12[uVar13].level) break;
                    puVar30 = puVar30 + 1;
                  }
                  *(uint *)((long)&pCVar21[1].field_0 + (uVar16 & 0xffffffff) * 4) = uVar22;
                  *(uint *)&pCVar21[1].field_0 = uVar35;
                  *(int *)((long)&pCVar21[1].field_0 + 4) = (int)profile;
                }
                watch_literal(this,(int)profile,uVar35,pCVar21);
                pWVar19 = pWVar24;
                goto LAB_0067de89;
              }
              pWVar24->blit = (int)profile;
              pWVar19 = pWVar25;
            }
            else {
              pWVar24->blit = uVar35;
              pWVar19 = pWVar25;
            }
          }
        }
      }
      goto LAB_0067de89;
    }
LAB_0067e0c3:
    if (pWVar25 != pWVar36) {
      lVar33 = -(long)pWVar25;
      for (; pWVar36 != pWVar10; pWVar36 = pWVar36 + 1) {
        iVar3 = pWVar36->blit;
        iVar18 = pWVar36->size;
        pWVar25->clause = pWVar36->clause;
        pWVar25->blit = iVar3;
        pWVar25->size = iVar18;
        pWVar25 = pWVar25 + 1;
        lVar33 = lVar33 + -0x10;
      }
      profile = (Profile *)
                (-((long)&(pvVar9[uVar20].
                           super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>.
                           _M_impl.super__Vector_impl_data._M_start)->clause + lVar33) >> 4);
      std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>::resize
                (pvVar9 + uVar20,(size_type)profile);
    }
  }
  if (this->searching_lucky_phases == false) {
    sVar23 = this->propagated;
    piVar1 = &(this->stats).propagations.search;
    *piVar1 = *piVar1 + (sVar23 - sVar6);
    if (pCVar21 != (Clause *)0x0) {
      if (this->stable == true) {
        piVar1 = &(this->stats).stabconflicts;
        *piVar1 = *piVar1 + 1;
      }
      piVar1 = &(this->stats).conflicts;
      *piVar1 = *piVar1 + 1;
      sVar23 = (size_t)(this->control).
                       super__Vector_base<CaDiCaL::Level,_std::allocator<CaDiCaL::Level>_>._M_impl.
                       super__Vector_impl_data._M_start[this->level].trail;
    }
    this->no_conflict_until = sVar23;
  }
  pIVar5 = this->internal;
  if ((pIVar5->profiles).propagate.level <= (pIVar5->opts).profile) {
    time(pIVar5,(time_t *)profile);
    stop_profiling(pIVar5,&(pIVar5->profiles).propagate,
                   (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    pCVar21 = this->conflict;
  }
  return pCVar21 == (Clause *)0x0;
}

Assistant:

bool Internal::propagate () {

  if (level)
    require_mode (SEARCH);
  assert (!unsat);

  START (propagate);

  // Updating statistics counter in the propagation loops is costly so we
  // delay until propagation ran to completion.
  //
  int64_t before = propagated;

  while (!conflict && propagated != trail.size ()) {

    const int lit = -trail[propagated++];
    LOG ("propagating %d", -lit);
    Watches &ws = watches (lit);

    const const_watch_iterator eow = ws.end ();
    watch_iterator j = ws.begin ();
    const_watch_iterator i = j;

    while (i != eow) {

      const Watch w = *j++ = *i++;
      const signed char b = val (w.blit);

      if (b > 0)
        continue; // blocking literal satisfied

      if (w.binary ()) {

        // assert (w.clause->redundant || !w.clause->garbage);

        // In principle we can ignore garbage binary clauses too, but that
        // would require to dereference the clause pointer all the time with
        //
        // if (w.clause->garbage) { j--; continue; } // (*)
        //
        // This is too costly.  It is however necessary to produce correct
        // proof traces if binary clauses are traced to be deleted ('d ...'
        // line) immediately as soon they are marked as garbage.  Actually
        // finding instances where this happens is pretty difficult (six
        // parallel fuzzing jobs in parallel took an hour), but it does
        // occur.  Our strategy to avoid generating incorrect proofs now is
        // to delay tracing the deletion of binary clauses marked as garbage
        // until they are really deleted from memory.  For large clauses
        // this is not necessary since we have to access the clause anyhow.
        //
        // Thanks go to Mathias Fleury, who wanted me to explain why the
        // line '(*)' above was in the code. Removing it actually really
        // improved running times and thus I tried to find concrete
        // instances where this happens (which I found), and then
        // implemented the described fix.

        // Binary clauses are treated separately since they do not require
        // to access the clause at all (only during conflict analysis, and
        // there also only to simplify the code).

        if (b < 0)
          conflict = w.clause; // but continue ...
        else {
          build_chain_for_units (w.blit, w.clause, 0);
          search_assign (w.blit, w.clause);
          // lrat_chain.clear (); done in search_assign
        }

      } else {
        assert (w.clause->size > 2);

        if (conflict)
          break; // Stop if there was a binary conflict already.

        // The cache line with the clause data is forced to be loaded here
        // and thus this first memory access below is the real hot-spot of
        // the solver.  Note, that this check is positive very rarely and
        // thus branch prediction should be almost perfect here.

        if (w.clause->garbage) {
          j--;
          continue;
        }

        literal_iterator lits = w.clause->begin ();

        // Simplify code by forcing 'lit' to be the second literal in the
        // clause.  This goes back to MiniSAT.  We use a branch-less version
        // for conditionally swapping the first two literals, since it
        // turned out to be substantially faster than this one
        //
        //  if (lits[0] == lit) swap (lits[0], lits[1]);
        //
        // which achieves the same effect, but needs a branch.
        //
        const int other = lits[0] ^ lits[1] ^ lit;
        const signed char u = val (other); // value of the other watch

        if (u > 0)
          j[-1].blit = other; // satisfied, just replace blit
        else {

          // This follows Ian Gent's (JAIR'13) idea of saving the position
          // of the last watch replacement.  In essence it needs two copies
          // of the default search for a watch replacement (in essence the
          // code in the 'if (v < 0) { ... }' block below), one starting at
          // the saved position until the end of the clause and then if that
          // one failed to find a replacement another one starting at the
          // first non-watched literal until the saved position.

          const int size = w.clause->size;
          const literal_iterator middle = lits + w.clause->pos;
          const const_literal_iterator end = lits + size;
          literal_iterator k = middle;

          // Find replacement watch 'r' at position 'k' with value 'v'.

          int r = 0;
          signed char v = -1;

          while (k != end && (v = val (r = *k)) < 0)
            k++;

          if (v < 0) { // need second search starting at the head?

            k = lits + 2;
            assert (w.clause->pos <= size);
            while (k != middle && (v = val (r = *k)) < 0)
              k++;
          }

          w.clause->pos = k - lits; // always save position

          assert (lits + 2 <= k), assert (k <= w.clause->end ());

          if (v > 0) {

            // Replacement satisfied, so just replace 'blit'.

            j[-1].blit = r;

          } else if (!v) {

            // Found new unassigned replacement literal to be watched.

            LOG (w.clause, "unwatch %d in", lit);

            lits[0] = other;
            lits[1] = r;
            *k = lit;

            watch_literal (r, lit, w.clause);

            j--; // Drop this watch from the watch list of 'lit'.

          } else if (!u) {

            assert (v < 0);

            // The other watch is unassigned ('!u') and all other literals
            // assigned to false (still 'v < 0'), thus we found a unit.
            //
            build_chain_for_units (other, w.clause, 0);
            search_assign (other, w.clause);
            // lrat_chain.clear (); done in search_assign

            // Similar code is in the implementation of the SAT'18 paper on
            // chronological backtracking but in our experience, this code
            // first does not really seem to be necessary for correctness,
            // and further does not improve running time either.
            //
            if (opts.chrono > 1) {

              const int other_level = var (other).level;

              if (other_level > var (lit).level) {

                // The assignment level of the new unit 'other' is larger
                // than the assignment level of 'lit'.  Thus we should find
                // another literal in the clause at that higher assignment
                // level and watch that instead of 'lit'.

                assert (size > 2);

                int pos, s = 0;

                for (pos = 2; pos < size; pos++)
                  if (var (s = lits[pos]).level == other_level)
                    break;

                assert (s);
                assert (pos < size);

                LOG (w.clause, "unwatch %d in", lit);
                lits[pos] = lit;
                lits[0] = other;
                lits[1] = s;
                watch_literal (s, other, w.clause);

                j--; // Drop this watch from the watch list of 'lit'.
              }
            }
          } else {

            assert (u < 0);
            assert (v < 0);

            // The other watch is assigned false ('u < 0') and all other
            // literals as well (still 'v < 0'), thus we found a conflict.

            conflict = w.clause;
            break;
          }
        }
      }
    }

    if (j != i) {

      while (i != eow)
        *j++ = *i++;

      ws.resize (j - ws.begin ());
    }
  }

  if (searching_lucky_phases) {

    if (conflict)
      LOG (conflict, "ignoring lucky conflict");

  } else {

    // Avoid updating stats eagerly in the hot-spot of the solver.
    //
    stats.propagations.search += propagated - before;

    if (!conflict)
      no_conflict_until = propagated;
    else {

      if (stable)
        stats.stabconflicts++;
      stats.conflicts++;

      LOG (conflict, "conflict");

      // The trail before the current decision level was conflict free.
      //
      no_conflict_until = control[level].trail;
    }
  }

  STOP (propagate);

  return !conflict;
}